

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall
caffe::V1LayerParameter::set_type(V1LayerParameter *this,V1LayerParameter_LayerType value)

{
  uint32 *puVar1;
  
  if (value < (V1LayerParameter_LayerType_DUMMY_DATA|V1LayerParameter_LayerType_FLATTEN)) {
    puVar1 = (this->_has_bits_).has_bits_ + 1;
    *(byte *)puVar1 = (byte)*puVar1 | 1;
    this->type_ = value;
    return;
  }
  __assert_fail("::caffe::V1LayerParameter_LayerType_IsValid(value)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/include/caffe/proto/caffe.pb.h"
                ,0x5996,
                "void caffe::V1LayerParameter::set_type(::caffe::V1LayerParameter_LayerType)");
}

Assistant:

bool V1LayerParameter_LayerType_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 11:
    case 12:
    case 13:
    case 14:
    case 15:
    case 16:
    case 17:
    case 18:
    case 19:
    case 20:
    case 21:
    case 22:
    case 23:
    case 24:
    case 25:
    case 26:
    case 27:
    case 28:
    case 29:
    case 30:
    case 31:
    case 32:
    case 33:
    case 34:
    case 35:
    case 36:
    case 37:
    case 38:
    case 39:
      return true;
    default:
      return false;
  }
}